

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O1

bool __thiscall State::isFinished(State *this)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  uVar3 = (ulong)this->height;
  bVar7 = (long)uVar3 < 1;
  if (0 < (long)uVar3) {
    uVar1 = this->width;
    lVar5 = 0;
    uVar4 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar6 = 1;
        bVar2 = 0 < (long)(int)uVar1;
        do {
          if (((int)lVar5 - this->size) + (int)uVar6 == 0) {
            if (this->tiles[uVar4][uVar6 - 1] != 0) goto LAB_00104869;
          }
          else if ((int)lVar5 + (int)uVar6 != this->tiles[uVar4][uVar6 - 1]) {
LAB_00104869:
            if (bVar2) {
              return bVar7;
            }
            break;
          }
          bVar2 = (long)uVar6 < (long)(int)uVar1;
          bVar8 = uVar6 != uVar1;
          uVar6 = uVar6 + 1;
        } while (bVar8);
      }
      uVar4 = uVar4 + 1;
      bVar7 = uVar3 <= uVar4;
      lVar5 = lVar5 + (ulong)uVar1;
    } while (uVar4 != uVar3);
  }
  return bVar7;
}

Assistant:

bool State::isFinished() {
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            int expected = 1 + i * width + j;
            int actual = tiles[i][j];

            if (expected == size) {
                if (actual != 0) {
                    return false;
                }
            } else {
                if (actual != expected) {
                    return false;
                }
            }
        }
    }
    return true;
}